

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.hpp
# Opt level: O1

string * __thiscall
Lib::Exception::
toString<char_const*,char_const*,char_const*,std::__cxx11::string,char_const*,unsigned_int>
          (string *__return_storage_ptr__,Exception *this,char *msg,char *msg_1,char *msg_2,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *msg_3,char *msg_4,
          uint msg_5)

{
  pointer pcVar1;
  stringstream out;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  pcVar1 = (msg_3->_M_dataplus)._M_p;
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1d8,pcVar1,pcVar1 + msg_3->_M_string_length);
  OutputAll<const_char_*,_const_char_*,_const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_unsigned_int>
  ::apply(local_1a8,msg,msg_1,msg_2,&local_1d8,msg_4,msg_5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string toString(Msg... msg){
    std::stringstream out;
    OutputAll<Msg...>::apply(out, msg...);
    return out.str();
  }